

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

ly_set * lyd_find_instance(lyd_node *data,lys_node *schema)

{
  lyd_node **pplVar1;
  uint uVar2;
  uint8_t *puVar3;
  lyd_node *plVar4;
  uint uVar5;
  ly_set *set;
  ly_set *set_00;
  ly_set *set_01;
  lyd_node *node;
  lys_node *plVar6;
  long lVar7;
  ulong uVar8;
  
  if ((schema == (lys_node *)0x0 || data == (lyd_node *)0x0) ||
     ((schema->nodetype & 0xc1bd) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_find_instance");
    return (ly_set *)0x0;
  }
  set = ly_set_new();
  set_00 = ly_set_new();
  if (set_00 != (ly_set *)0x0 && set != (ly_set *)0x0) {
    do {
      pplVar1 = &data->parent;
      plVar4 = data;
      data = *pplVar1;
    } while (*pplVar1 != (lyd_node *)0x0);
    do {
      node = plVar4;
      plVar4 = node->prev;
      plVar6 = schema;
    } while (node->prev->next != (lyd_node *)0x0);
    do {
      lVar7 = 0x58;
      if ((plVar6->nodetype != LYS_AUGMENT) &&
         (lVar7 = 0x40, (plVar6->nodetype & 0xc1bd) != LYS_UNKNOWN)) {
        ly_set_add(set_00,plVar6,1);
      }
      puVar3 = plVar6->padding;
      plVar6 = *(lys_node **)(puVar3 + lVar7 + -0x1c);
    } while (*(lys_node **)(puVar3 + lVar7 + -0x1c) != (lys_node *)0x0);
    uVar2 = set_00->number;
    if (uVar2 == 0) goto LAB_0016c8be;
    if (node != (lyd_node *)0x0) {
      do {
        if (node->schema == (set_00->set).s[set_00->number - 1]) {
          ly_set_add(set,node,1);
        }
        node = node->next;
      } while (node != (lyd_node *)0x0);
      uVar2 = set_00->number;
    }
    while( true ) {
      if ((uVar2 - 1 == 0) || (set->number == 0)) {
        free((set_00->set).s);
        free(set_00);
        return set;
      }
      set_01 = ly_set_new();
      if (set_01 == (ly_set *)0x0) break;
      uVar5 = set->number;
      if (uVar5 != 0) {
        uVar8 = 0;
        do {
          plVar6 = (set->set).s[uVar8]->parent;
          if (plVar6 != (lys_node *)0x0) {
            do {
              if ((lys_node *)plVar6->name == (set_00->set).s[uVar2 - 2]) {
                ly_set_add(set_01,plVar6,1);
              }
              plVar6 = *(lys_node **)&plVar6->flags;
            } while (plVar6 != (lys_node *)0x0);
            uVar5 = set->number;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
      }
      free((set->set).s);
      free(set);
      set = set_01;
      uVar2 = uVar2 - 1;
    }
  }
  ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_find_instance"
        );
LAB_0016c8be:
  ly_set_free(set);
  ly_set_free(set_00);
  return (ly_set *)0x0;
}

Assistant:

ly_set *
lyd_find_instance(const struct lyd_node *data, const struct lys_node *schema)
{
    struct ly_set *ret, *ret_aux, *spath;
    const struct lys_node *siter;
    struct lyd_node *iter;
    unsigned int i, j;

    if (!data || !schema ||
            !(schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        LOGARG;
        return NULL;
    }

    ret = ly_set_new();
    spath = ly_set_new();
    if (!ret || !spath) {
        LOGMEM(schema->module->ctx);
        goto error;
    }

    /* find data root */
    while (data->parent) {
        /* vertical move (up) */
        data = data->parent;
    }
    while (data->prev->next) {
        /* horizontal move (left) */
        data = data->prev;
    }

    /* build schema path */
    for (siter = schema; siter; ) {
        if (siter->nodetype == LYS_AUGMENT) {
            siter = ((struct lys_node_augment *)siter)->target;
            continue;
        } else if (siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_ANYDATA | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
            /* standard data node */
            ly_set_add(spath, (void*)siter, LY_SET_OPT_USEASLIST);

        } /* else skip the rest node types */
        siter = siter->parent;
    }
    if (!spath->number) {
        /* no valid path */
        goto error;
    }

    /* start searching */
    LY_TREE_FOR((struct lyd_node *)data, iter) {
        if (iter->schema == spath->set.s[spath->number - 1]) {
            ly_set_add(ret, iter, LY_SET_OPT_USEASLIST);
        }
    }
    for (i = spath->number - 1; i; i--) {
        if (!ret->number) {
            /* nothing found */
            break;
        }

        ret_aux = ly_set_new();
        if (!ret_aux) {
            LOGMEM(schema->module->ctx);
            goto error;
        }
        for (j = 0; j < ret->number; j++) {
            LY_TREE_FOR(ret->set.d[j]->child, iter) {
                if (iter->schema == spath->set.s[i - 1]) {
                    ly_set_add(ret_aux, iter, LY_SET_OPT_USEASLIST);
                }
            }
        }
        ly_set_free(ret);
        ret = ret_aux;
    }

    ly_set_free(spath);
    return ret;

error:
    ly_set_free(ret);
    ly_set_free(spath);

    return NULL;
}